

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::TestFSChaCha20Poly1305
          (CryptoTest *this,string *plain_hex,string *aad_hex,string *key_hex,uint64_t msg_idx,
          string *cipher_hex)

{
  Span<const_std::byte> key_00;
  Span<const_std::byte> key_01;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  Span<const_std::byte> aad_00;
  Span<const_std::byte> aad_01;
  Span<const_std::byte> aad_02;
  Span<const_std::byte> aad_03;
  Span<const_std::byte> plain_00;
  Span<const_std::byte> plain_01;
  Span<const_std::byte> cipher_00;
  Span<const_std::byte> cipher_01;
  Span<const_std::byte> plain2;
  Span<std::byte> cipher_02;
  Span<std::byte> cipher_03;
  Span<const_std::byte> plain1;
  Span<std::byte> plain_02;
  Span<std::byte> plain_03;
  Span<const_std::byte> aad_04;
  bool bVar1;
  size_type sVar2;
  byte *pbVar3;
  unsigned_long uVar4;
  FSChaCha20Poly1305 *this_00;
  long in_RDI;
  byte *in_R8;
  long in_FS_OFFSET;
  __sv_type plain2_00;
  __sv_type cipher_04;
  __sv_type aad_05;
  bool ret;
  uint64_t i_1;
  uint64_t i;
  size_t prefix;
  int it;
  vector<std::byte,_std::allocator<std::byte>_> decipher;
  vector<std::byte,_std::allocator<std::byte>_> cipher;
  vector<std::byte,_std::allocator<std::byte>_> expected_cipher;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<std::byte,_std::allocator<std::byte>_> aad;
  vector<std::byte,_std::allocator<std::byte>_> plain;
  FSChaCha20Poly1305 dec_aead;
  FSChaCha20Poly1305 enc_aead;
  byte dummy_tag [16];
  FSChaCha20Poly1305 *in_stack_fffffffffffff958;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *this_01;
  lazy_ostream *in_stack_fffffffffffff960;
  lazy_ostream *prev;
  FSChaCha20Poly1305 *in_stack_fffffffffffff968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff978;
  lazy_ostream *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  const_string *in_stack_fffffffffffff990;
  FSChaCha20Poly1305 *in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  char *in_stack_fffffffffffff9c8;
  byte *in_stack_fffffffffffff9d0;
  undefined1 *puVar5;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  byte *in_stack_fffffffffffffa00;
  byte *pbVar6;
  size_t sVar7;
  undefined4 in_stack_fffffffffffffa18;
  int iVar8;
  Span<std::byte> in_stack_fffffffffffffa40;
  const_string local_560 [2];
  lazy_ostream local_540 [3];
  const_string local_4e8 [2];
  lazy_ostream local_4c8 [2];
  assertion_result local_4a8 [3];
  Span<std::byte> local_460;
  Span<std::byte> local_440;
  FSChaCha20Poly1305 *local_410;
  lazy_ostream *local_408;
  Span<std::byte> local_3b0;
  Span<std::byte> local_390;
  const_string local_350 [2];
  lazy_ostream local_330 [2];
  assertion_result local_310 [2];
  FSChaCha20Poly1305 *local_2d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *local_2c8;
  lazy_ostream *local_2c0;
  Span<std::byte> local_2a8;
  Span<std::byte> local_278;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *local_258;
  lazy_ostream *local_250;
  FSChaCha20Poly1305 *local_228;
  lazy_ostream *local_220;
  Span<std::byte> local_208;
  Span<std::byte> local_1d8;
  undefined1 local_1a1 [393];
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff978);
  hex_str._M_len._7_1_ = in_stack_fffffffffffff9c7;
  hex_str._M_len._0_7_ = in_stack_fffffffffffff9c0;
  hex_str._M_str = in_stack_fffffffffffff9c8;
  ParseHex<std::byte>(hex_str);
  plain2_00 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff978);
  hex_str_00._M_len._7_1_ = in_stack_fffffffffffff9c7;
  hex_str_00._M_len._0_7_ = in_stack_fffffffffffff9c0;
  hex_str_00._M_str = in_stack_fffffffffffff9c8;
  ParseHex<std::byte>(hex_str_00);
  cipher_04 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff978);
  hex_str_01._M_len._7_1_ = in_stack_fffffffffffff9c7;
  hex_str_01._M_len._0_7_ = in_stack_fffffffffffff9c0;
  hex_str_01._M_str = in_stack_fffffffffffff9c8;
  ParseHex<std::byte>(hex_str_01);
  aad_05 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff978);
  hex_str_02._M_len._7_1_ = in_stack_fffffffffffff9c7;
  hex_str_02._M_len._0_7_ = in_stack_fffffffffffff9c0;
  hex_str_02._M_str = in_stack_fffffffffffff9c8;
  ParseHex<std::byte>(hex_str_02);
  sVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                    ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff958);
  pbVar3 = (byte *)(sVar2 + 0x10);
  puVar5 = local_1a1;
  std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_fffffffffffff958);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
             (size_type)in_stack_fffffffffffff980,(allocator_type *)in_stack_fffffffffffff978);
  std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_fffffffffffff958);
  for (iVar8 = 0; iVar8 < 10; iVar8 = iVar8 + 1) {
    if (iVar8 == 0) {
      uVar4 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                        ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff958)
      ;
    }
    else {
      in_stack_fffffffffffff9d0 = (byte *)(in_RDI + 0x110);
      std::vector<std::byte,_std::allocator<std::byte>_>::size
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff958);
      uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff980,
                         (unsigned_long)in_stack_fffffffffffff978);
    }
    local_18 = 0;
    uStack_10 = 0;
    sVar7 = uVar4;
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_fffffffffffff968,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
               in_stack_fffffffffffff958);
    key_00.m_size._0_7_ = in_stack_fffffffffffff988;
    key_00.m_data = (byte *)in_stack_fffffffffffff980;
    key_00.m_size._7_1_ = in_stack_fffffffffffff98f;
    FSChaCha20Poly1305::FSChaCha20Poly1305
              (in_stack_fffffffffffff968,key_00,(uint32_t)((ulong)in_stack_fffffffffffff960 >> 0x20)
              );
    for (pbVar6 = (byte *)0x0; pbVar6 < in_R8; pbVar6 = pbVar6 + 1) {
      Span<std::byte>::Span<16>
                ((Span<std::byte> *)in_stack_fffffffffffff958,(byte (*) [16])0x585d86);
      local_1d8 = Span<std::byte>::first
                            ((Span<std::byte> *)in_stack_fffffffffffff968,
                             (size_t)in_stack_fffffffffffff960);
      Span<const_std::byte>::Span<std::byte,_0>
                ((Span<const_std::byte> *)in_stack_fffffffffffff958,(Span<std::byte> *)0x585dbc);
      Span<std::byte>::Span<16>
                ((Span<std::byte> *)in_stack_fffffffffffff958,(byte (*) [16])0x585dd1);
      local_208 = Span<std::byte>::first
                            ((Span<std::byte> *)in_stack_fffffffffffff968,
                             (size_t)in_stack_fffffffffffff960);
      Span<const_std::byte>::Span<std::byte,_0>
                ((Span<const_std::byte> *)in_stack_fffffffffffff958,(Span<std::byte> *)0x585e07);
      Span<std::byte>::Span<16>
                ((Span<std::byte> *)in_stack_fffffffffffff958,(byte (*) [16])0x585e1c);
      plain_00.m_size = (size_t)puVar5;
      plain_00.m_data = pbVar3;
      aad_00.m_size = uVar4;
      aad_00.m_data = in_stack_fffffffffffff9d0;
      cipher_02.m_size = (size_t)pbVar6;
      cipher_02.m_data = in_stack_fffffffffffffa00;
      in_stack_fffffffffffff958 = local_228;
      in_stack_fffffffffffff960 = local_220;
      FSChaCha20Poly1305::Encrypt
                ((FSChaCha20Poly1305 *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988)
                 ,plain_00,aad_00,cipher_02);
    }
    if (iVar8 == 0) {
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
      plain_01.m_size = (size_t)puVar5;
      plain_01.m_data = pbVar3;
      aad_01.m_size = uVar4;
      aad_01.m_data = in_stack_fffffffffffff9d0;
      cipher_03.m_size = (size_t)pbVar6;
      cipher_03.m_data = in_stack_fffffffffffffa00;
      this_01 = local_258;
      prev = local_250;
      FSChaCha20Poly1305::Encrypt
                ((FSChaCha20Poly1305 *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988)
                 ,plain_01,aad_01,cipher_03);
    }
    else {
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
      local_278 = Span<std::byte>::first
                            ((Span<std::byte> *)in_stack_fffffffffffff968,
                             (size_t)in_stack_fffffffffffff960);
      Span<const_std::byte>::Span<std::byte,_0>
                ((Span<const_std::byte> *)in_stack_fffffffffffff958,(Span<std::byte> *)0x586033);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
      local_2a8 = Span<std::byte>::subspan
                            ((Span<std::byte> *)in_stack_fffffffffffff968,
                             (size_t)in_stack_fffffffffffff960);
      Span<const_std::byte>::Span<std::byte,_0>
                ((Span<const_std::byte> *)in_stack_fffffffffffff958,(Span<std::byte> *)0x586088);
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
      plain1.m_size = (size_t)pbVar6;
      plain1.m_data = in_stack_fffffffffffffa00;
      plain2.m_size._0_7_ = in_stack_fffffffffffff9f8;
      plain2.m_data = (byte *)in_RDI;
      plain2.m_size._7_1_ = in_stack_fffffffffffff9ff;
      this_01 = local_2c8;
      prev = local_2c0;
      in_stack_fffffffffffff968 = local_2d8;
      FSChaCha20Poly1305::Encrypt
                (in_stack_fffffffffffff998,plain1,plain2,(Span<const_std::byte>)aad_05,
                 (Span<std::byte>)cipher_04);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,(pointer)prev,
                 (unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                 CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                 (const_string *)in_stack_fffffffffffff980);
      std::operator==((vector<std::byte,_std::allocator<std::byte>_> *)
                      CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                      (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff980);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff968,SUB81((ulong)prev >> 0x38,0));
      this_00 = (FSChaCha20Poly1305 *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,(pointer)prev,
                 (unsigned_long)this_01);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,(pointer)prev,
                 (unsigned_long)this_01);
      this_01 = (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                 *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_310,local_330,local_350,0x140,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(this_01);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_fffffffffffff968,
               (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
    key_01.m_size._0_7_ = in_stack_fffffffffffff988;
    key_01.m_data = (byte *)in_stack_fffffffffffff980;
    key_01.m_size._7_1_ = in_stack_fffffffffffff98f;
    FSChaCha20Poly1305::FSChaCha20Poly1305
              (in_stack_fffffffffffff968,key_01,(uint32_t)((ulong)prev >> 0x20));
    for (in_stack_fffffffffffffa00 = (byte *)0x0; in_stack_fffffffffffffa00 < in_R8;
        in_stack_fffffffffffffa00 = in_stack_fffffffffffffa00 + 1) {
      Span<const_std::byte>::Span<16>((Span<const_std::byte> *)this_01,(byte (*) [16])0x5862da);
      Span<std::byte>::Span<16>((Span<std::byte> *)this_01,(byte (*) [16])0x5862ef);
      local_390 = Span<std::byte>::first((Span<std::byte> *)in_stack_fffffffffffff968,(size_t)prev);
      Span<const_std::byte>::Span<std::byte,_0>
                ((Span<const_std::byte> *)this_01,(Span<std::byte> *)0x586325);
      Span<std::byte>::Span<16>((Span<std::byte> *)this_01,(byte (*) [16])0x58633a);
      local_3b0 = Span<std::byte>::first((Span<std::byte> *)in_stack_fffffffffffff968,(size_t)prev);
      cipher_00.m_size = (size_t)puVar5;
      cipher_00.m_data = pbVar3;
      aad_02.m_size = uVar4;
      aad_02.m_data = in_stack_fffffffffffff9d0;
      plain_02.m_size = (size_t)pbVar6;
      plain_02.m_data = in_stack_fffffffffffffa00;
      this_01 = (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                 *)local_3b0.m_data;
      prev = (lazy_ostream *)local_3b0.m_size;
      FSChaCha20Poly1305::Decrypt
                ((FSChaCha20Poly1305 *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988)
                 ,cipher_00,aad_02,plain_02);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::size
              ((vector<std::byte,_std::allocator<std::byte>_> *)this_01);
    std::allocator<std::byte>::allocator((allocator<std::byte> *)this_01);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
               (size_type)in_stack_fffffffffffff980,(allocator_type *)in_stack_fffffffffffff978);
    std::allocator<std::byte>::~allocator((allocator<std::byte> *)this_01);
    if (iVar8 == 0) {
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
      cipher_01.m_size = (size_t)puVar5;
      cipher_01.m_data = pbVar3;
      aad_03.m_size = uVar4;
      aad_03.m_data = in_stack_fffffffffffff9d0;
      plain_03.m_size = (size_t)pbVar6;
      plain_03.m_data = in_stack_fffffffffffffa00;
      in_stack_fffffffffffff958 = local_410;
      in_stack_fffffffffffff960 = local_408;
      in_stack_fffffffffffff9ff =
           FSChaCha20Poly1305::Decrypt
                     ((FSChaCha20Poly1305 *)
                      CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),cipher_01,aad_03
                      ,plain_03);
    }
    else {
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
      local_440 = Span<std::byte>::first((Span<std::byte> *)in_stack_fffffffffffff968,(size_t)prev);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffff968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)prev,this_01);
      local_460 = Span<std::byte>::subspan
                            ((Span<std::byte> *)in_stack_fffffffffffff968,(size_t)prev);
      aad_04.m_size._0_4_ = in_stack_fffffffffffffa18;
      aad_04.m_data = (byte *)sVar7;
      aad_04.m_size._4_4_ = iVar8;
      in_stack_fffffffffffff958 = (FSChaCha20Poly1305 *)local_440.m_data;
      in_stack_fffffffffffff960 = (lazy_ostream *)local_440.m_size;
      in_stack_fffffffffffff968 = (FSChaCha20Poly1305 *)local_460.m_data;
      in_stack_fffffffffffff9ff =
           FSChaCha20Poly1305::Decrypt
                     (this_00,(Span<const_std::byte>)aad_05,aad_04,in_stack_fffffffffffffa40,
                      (Span<std::byte>)plain2_00);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
                 (pointer)in_stack_fffffffffffff960,(unsigned_long)in_stack_fffffffffffff958);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                 CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                 (const_string *)in_stack_fffffffffffff980);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff968,
                 SUB81((ulong)in_stack_fffffffffffff960 >> 0x38,0));
      in_stack_fffffffffffff998 = (FSChaCha20Poly1305 *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
                 (pointer)in_stack_fffffffffffff960,(unsigned_long)in_stack_fffffffffffff958);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff960,(basic_cstring<const_char> *)in_stack_fffffffffffff958);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
                 (pointer)in_stack_fffffffffffff960,(unsigned_long)in_stack_fffffffffffff958);
      in_stack_fffffffffffff958 = (FSChaCha20Poly1305 *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_4a8,local_4c8,local_4e8,0x150,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff958);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff958);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      in_stack_fffffffffffff990 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
                 (pointer)in_stack_fffffffffffff960,(unsigned_long)in_stack_fffffffffffff958);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff958);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                 CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                 (const_string *)in_stack_fffffffffffff980);
      in_stack_fffffffffffff98f =
           std::operator==((vector<std::byte,_std::allocator<std::byte>_> *)
                           CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                           (vector<std::byte,_std::allocator<std::byte>_> *)
                           in_stack_fffffffffffff980);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff968,
                 SUB81((ulong)in_stack_fffffffffffff960 >> 0x38,0));
      in_stack_fffffffffffff980 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
                 (pointer)in_stack_fffffffffffff960,(unsigned_long)in_stack_fffffffffffff958);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff960,(basic_cstring<const_char> *)in_stack_fffffffffffff958);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff968,
                 (pointer)in_stack_fffffffffffff960,(unsigned_long)in_stack_fffffffffffff958);
      in_stack_fffffffffffff958 = (FSChaCha20Poly1305 *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)(local_540 + 2),local_540,local_560,0x151,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff958);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff958);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff968);
    FSChaCha20Poly1305::~FSChaCha20Poly1305(in_stack_fffffffffffff958);
    FSChaCha20Poly1305::~FSChaCha20Poly1305(in_stack_fffffffffffff958);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff968);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff968);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff968);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff968);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff968);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestFSChaCha20Poly1305(const std::string& plain_hex, const std::string& aad_hex, const std::string& key_hex, uint64_t msg_idx, const std::string& cipher_hex)
{
    auto plain = ParseHex<std::byte>(plain_hex);
    auto aad = ParseHex<std::byte>(aad_hex);
    auto key = ParseHex<std::byte>(key_hex);
    auto expected_cipher = ParseHex<std::byte>(cipher_hex);
    std::vector<std::byte> cipher(plain.size() + FSChaCha20Poly1305::EXPANSION);

    for (int it = 0; it < 10; ++it) {
        // During it==0 we use the single-plain Encrypt/Decrypt; others use a split at prefix.
        size_t prefix = it ? m_rng.randrange(plain.size() + 1) : plain.size();
        std::byte dummy_tag[FSChaCha20Poly1305::EXPANSION] = {{}};

        // Do msg_idx dummy encryptions to seek to the correct packet.
        FSChaCha20Poly1305 enc_aead{key, 224};
        for (uint64_t i = 0; i < msg_idx; ++i) {
            enc_aead.Encrypt(Span{dummy_tag}.first(0), Span{dummy_tag}.first(0), dummy_tag);
        }

        // Invoke single-plain or plain1/plain2 Encrypt.
        if (it == 0) {
            enc_aead.Encrypt(plain, aad, cipher);
        } else {
            enc_aead.Encrypt(Span{plain}.first(prefix), Span{plain}.subspan(prefix), aad, cipher);
        }
        BOOST_CHECK(cipher == expected_cipher);

        // Do msg_idx dummy decryptions to seek to the correct packet.
        FSChaCha20Poly1305 dec_aead{key, 224};
        for (uint64_t i = 0; i < msg_idx; ++i) {
            dec_aead.Decrypt(dummy_tag, Span{dummy_tag}.first(0), Span{dummy_tag}.first(0));
        }

        // Invoke single-plain or plain1/plain2 Decrypt.
        std::vector<std::byte> decipher(cipher.size() - AEADChaCha20Poly1305::EXPANSION);
        bool ret{false};
        if (it == 0) {
            ret = dec_aead.Decrypt(cipher, aad, decipher);
        } else {
            ret = dec_aead.Decrypt(cipher, aad, Span{decipher}.first(prefix), Span{decipher}.subspan(prefix));
        }
        BOOST_CHECK(ret);
        BOOST_CHECK(decipher == plain);
    }
}